

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::CheckOpcode3
          (TypeChecker *this,Opcode opcode,Limits *limits1,Limits *limits2,Limits *limits3)

{
  Type TVar1;
  Type TVar2;
  Type TVar3;
  char *desc;
  Limits *limits3_local;
  Limits *limits2_local;
  Limits *limits1_local;
  TypeChecker *this_local;
  Opcode opcode_local;
  Result result;
  
  this_local._0_4_ = opcode.enum_;
  TVar1 = Opcode::GetParamType1((Opcode *)&this_local);
  TVar1 = GetMemoryParam(TVar1,limits1);
  TVar2 = Opcode::GetParamType2((Opcode *)&this_local);
  TVar2 = GetMemoryParam(TVar2,limits2);
  TVar3 = Opcode::GetParamType3((Opcode *)&this_local);
  TVar3 = GetMemoryParam(TVar3,limits3);
  desc = Opcode::GetName((Opcode *)&this_local);
  this_local._4_4_ = PopAndCheck3Types(this,TVar1,TVar2,TVar3,desc);
  TVar1 = Opcode::GetResultType((Opcode *)&this_local);
  PushType(this,TVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode,
                                 const Limits* limits1,
                                 const Limits* limits2,
                                 const Limits* limits3) {
  Result result = PopAndCheck3Types(
      GetMemoryParam(opcode.GetParamType1(), limits1),
      GetMemoryParam(opcode.GetParamType2(), limits2),
      GetMemoryParam(opcode.GetParamType3(), limits3), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}